

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

double __thiscall
despot::RockSampleApproxParticleUpperBound::Value
          (RockSampleApproxParticleUpperBound *this,State *state)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  double dVar5;
  reference rVar6;
  byte local_e6;
  reference local_c8;
  _Bit_pointer local_b8;
  _Bit_pointer local_b0;
  reference local_a8;
  undefined8 local_98;
  _Bit_pointer local_90;
  int local_84;
  int local_80;
  int dist;
  int rock;
  Coord rock_pos;
  int local_70;
  int id;
  int shortest;
  allocator<bool> local_59;
  undefined1 local_58 [8];
  vector<bool,_std::allocator<bool>_> visited;
  Coord rob_pos;
  double discount;
  double value;
  State *state_local;
  RockSampleApproxParticleUpperBound *this_local;
  
  discount = 0.0;
  _rob_pos = 1.0;
  visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)BaseRockSample::GetRobPos(this->rs_model_,state);
  iVar2 = this->rs_model_->num_rocks_;
  std::allocator<bool>::allocator(&local_59);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_58,(long)iVar2,&local_59);
  std::allocator<bool>::~allocator(&local_59);
  while( true ) {
    local_70 = this->rs_model_->size_ * 2;
    _rock_pos = -1;
    despot::Coord::Coord((Coord *)&dist,-1,-1);
    for (local_80 = 0; local_80 < this->rs_model_->num_rocks_; local_80 = local_80 + 1) {
      local_90 = visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_end_of_storage;
      pvVar4 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                         (&this->rs_model_->rock_pos_,(long)local_80);
      local_98 = *(undefined8 *)pvVar4;
      local_84 = despot::Coord::ManhattanDistance(local_90,local_98);
      bVar1 = CheckFlag(*(int *)(state + 0xc),local_80);
      local_e6 = 0;
      if ((bVar1) && (local_e6 = 0, local_84 < local_70)) {
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_58,(long)local_80);
        local_a8 = rVar6;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_a8);
        local_e6 = bVar1 ^ 0xff;
      }
      if ((local_e6 & 1) != 0) {
        local_70 = local_84;
        _rock_pos = local_80;
        pvVar4 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                           (&this->rs_model_->rock_pos_,(long)local_80);
        _dist = *(_Bit_pointer *)pvVar4;
      }
    }
    if (_rock_pos == -1) break;
    local_b0 = _dist;
    local_b8 = visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
    iVar2 = despot::Coord::ManhattanDistance
                      (_dist,visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage);
    dVar5 = Globals::Discount(iVar2);
    _rob_pos = _rob_pos * dVar5;
    discount = _rob_pos * 10.0 + discount;
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_58,(long)_rock_pos);
    local_c8 = rVar6;
    std::_Bit_reference::operator=(&local_c8,true);
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = _dist;
  }
  iVar2 = this->rs_model_->size_;
  iVar3 = BaseRockSample::GetX(this->rs_model_,state);
  dVar5 = Globals::Discount(iVar2 - iVar3);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_58)
  ;
  return _rob_pos * 10.0 * dVar5 + discount;
}

Assistant:

double Value(const State& state) const {
		double value = 0;
		double discount = 1.0;
		Coord rob_pos = rs_model_->GetRobPos(&state);
		vector<bool> visited(rs_model_->num_rocks_);
		while (true) {
			// Move to the nearest valuable rock and sample
			int shortest = 2 * rs_model_->size_;
			int id = -1;
			Coord rock_pos(-1, -1);
			for (int rock = 0; rock < rs_model_->num_rocks_; rock++) {
				int dist = Coord::ManhattanDistance(rob_pos,
					rs_model_->rock_pos_[rock]);
				if (CheckFlag(state.state_id, rock) && dist < shortest
					&& !visited[rock]) {
					shortest = dist;
					id = rock;
					rock_pos = rs_model_->rock_pos_[rock];
				}
			}

			if (id == -1)
				break;

			discount *= Globals::Discount(Coord::ManhattanDistance(rock_pos, rob_pos));
			value += discount * 10.0;
			visited[id] = true;
			rob_pos = rock_pos;
		}

		value += 10.0 * discount
			* Globals::Discount(rs_model_->size_ - rs_model_->GetX(&state));
		return value;
	}